

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

real __thiscall
fasttext::NegativeSamplingLoss::forward
          (NegativeSamplingLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t targetIndex
          ,State *state,real lr,bool backprop)

{
  int32_t target;
  int target_00;
  pointer piVar1;
  result_type rVar2;
  int iVar3;
  float fVar4;
  real rVar5;
  
  if (targetIndex < 0) {
    __assert_fail("targetIndex >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/loss.cc"
                  ,0xaa,
                  "virtual real fasttext::NegativeSamplingLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  piVar1 = (targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ulong)((long)(targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <=
      (ulong)(uint)targetIndex) {
    __assert_fail("targetIndex < targets.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/loss.cc"
                  ,0xab,
                  "virtual real fasttext::NegativeSamplingLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  target = piVar1[(uint)targetIndex];
  fVar4 = BinaryLogisticLoss::binaryLogistic
                    (&this->super_BinaryLogisticLoss,target,state,true,lr,backprop);
  if (0 < this->neg_) {
    iVar3 = 0;
    do {
      do {
        rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                          (&this->uniform_,&state->rng,&(this->uniform_)._M_param);
        target_00 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[rVar2];
      } while (target_00 == target);
      rVar5 = BinaryLogisticLoss::binaryLogistic
                        (&this->super_BinaryLogisticLoss,target_00,state,false,lr,backprop);
      fVar4 = fVar4 + rVar5;
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->neg_);
  }
  return fVar4;
}

Assistant:

real NegativeSamplingLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  assert(targetIndex >= 0);
  assert(targetIndex < targets.size());
  int32_t target = targets[targetIndex];
  real loss = binaryLogistic(target, state, true, lr, backprop);

  for (int32_t n = 0; n < neg_; n++) {
    auto negativeTarget = getNegative(target, state.rng);
    loss += binaryLogistic(negativeTarget, state, false, lr, backprop);
  }
  return loss;
}